

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  bool bVar1;
  Node *pNVar2;
  long *in_RDI;
  ulong in_stack_00000018;
  Tree *tree;
  Node *head;
  Node *item;
  size_type b;
  bool is_list;
  iterator tree_it;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  InnerMap *in_stack_fffffffffffffeb0;
  InnerMap *in_stack_fffffffffffffeb8;
  TreeIterator *in_stack_ffffffffffffff50;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *in_stack_ffffffffffffff58;
  ulong local_70;
  _Rb_tree_const_iterator<google::protobuf::MapKey_*> local_60 [12];
  
  std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::_Rb_tree_const_iterator(local_60);
  bVar1 = iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
          ::revalidate_if_necessary(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_70 = in_stack_00000018;
  if (bVar1) {
    pNVar2 = EraseFromLinkedList(in_stack_fffffffffffffeb8,(Node *)in_stack_fffffffffffffeb0,
                                 (Node *)CONCAT17(in_stack_fffffffffffffeaf,
                                                  in_stack_fffffffffffffea8));
    *(Node **)(in_RDI[4] + in_stack_00000018 * 8) = pNVar2;
  }
  else {
    in_stack_fffffffffffffeb0 = *(InnerMap **)(in_RDI[4] + in_stack_00000018 * 8);
    std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
              ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)in_stack_fffffffffffffeb0);
    std::
    set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
    ::erase((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
             *)in_stack_fffffffffffffeb0,
            (key_type *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    bVar1 = std::
            set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
            ::empty((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                     *)0x43d96e);
    if (bVar1) {
      local_70 = in_stack_00000018 & 0xfffffffffffffffe;
      DestroyTree(in_stack_fffffffffffffeb0,
                  (Tree *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      *(undefined8 *)(in_RDI[4] + 8 + local_70 * 8) = 0;
      *(undefined8 *)(in_RDI[4] + local_70 * 8) = 0;
    }
  }
  DestroyNode(in_stack_fffffffffffffeb0,
              (Node *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  *in_RDI = *in_RDI + -1;
  if (local_70 == in_RDI[3]) {
    while( true ) {
      bVar1 = false;
      if ((ulong)in_RDI[3] < (ulong)in_RDI[1]) {
        bVar1 = *(long *)(in_RDI[4] + in_RDI[3] * 8) == 0;
      }
      if (!bVar1) break;
      in_RDI[3] = in_RDI[3] + 1;
    }
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(*tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = NULL;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == NULL) {
          ++index_of_first_non_null_;
        }
      }
    }